

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

void * gotcha_realloc(void *buffer,size_t size)

{
  ulong in_RSI;
  void *in_RDI;
  malloc_link_t *alloc;
  void *newbuffer;
  size_t in_stack_00000028;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if (*(ulong *)((long)in_RDI + -8) < in_RSI) {
    local_8 = gotcha_malloc(in_stack_00000028);
    if (local_8 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      gotcha_memcpy(local_8,in_RDI,*(ulong *)((long)in_RDI + -8));
      gotcha_free(in_RDI);
    }
  }
  return local_8;
}

Assistant:

void *gotcha_realloc(void* buffer, size_t size) 
{
   void *newbuffer;
   malloc_link_t *alloc;

   alloc = (malloc_link_t *) (((malloc_header_t *) buffer) - 1);

   if (size <= alloc->header.size)
      return buffer;

   newbuffer = gotcha_malloc(size);
   if (!newbuffer)
      return NULL;
   gotcha_memcpy(newbuffer, buffer, alloc->header.size);

   gotcha_free(buffer);

   return newbuffer;
}